

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall GameBoard::spawn_apple(GameBoard *this)

{
  pointer *pppAVar1;
  pointer ppAVar2;
  iterator __position;
  Apple *pAVar3;
  vector<int,_std::allocator<int>_> free_pos;
  Apple *local_30;
  vector<int,_std::allocator<int>_> local_28;
  
  ppAVar2 = (this->apples).super__Vector_base<Apple_*,_std::allocator<Apple_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->apples).super__Vector_base<Apple_*,_std::allocator<Apple_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppAVar2) {
    (this->apples).super__Vector_base<Apple_*,_std::allocator<Apple_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppAVar2 + -1;
  }
  pAVar3 = (Apple *)operator_new(0x10);
  pAVar3->game = this;
  random_free_pos(&local_28,this);
  pAVar3->pos_x =
       *local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start;
  pAVar3->pos_y =
       local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start[1];
  operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
  __position._M_current =
       (this->apples).super__Vector_base<Apple_*,_std::allocator<Apple_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->apples).super__Vector_base<Apple_*,_std::allocator<Apple_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_30 = pAVar3;
    std::vector<Apple*,std::allocator<Apple*>>::_M_realloc_insert<Apple*>
              ((vector<Apple*,std::allocator<Apple*>> *)&this->apples,__position,&local_30);
  }
  else {
    *__position._M_current = pAVar3;
    pppAVar1 = &(this->apples).super__Vector_base<Apple_*,_std::allocator<Apple_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  return;
}

Assistant:

void GameBoard::spawn_apple() {
    if(!this->apples.empty()) {
        this->apples.pop_back();
    }
    this->apples.push_back(new Apple(this));
}